

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::majorUpdatePrimal(HEkkDual *this)

{
  double dVar1;
  value_type vVar2;
  reference pvVar3;
  double *pdVar4;
  long in_RDI;
  double dVar5;
  double dVar6;
  double *in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  HVector *in_stack_00000030;
  HighsInt in_stack_00000038;
  HighsInt in_stack_0000003c;
  HEkk *in_stack_00000040;
  double aa_iRow_1;
  HighsInt jRow_1;
  HighsInt jFn_1;
  double value_1;
  HighsInt jRow;
  HighsInt jFn;
  double Kai_2;
  double *dseArray_1;
  double *colArray_1;
  double new_pivotal_edge_weight_2;
  HighsInt iRow_2;
  HighsInt iFn_3;
  vector<double,_std::allocator<double>_> *edge_weight_1;
  double value;
  HighsInt iRow_1;
  MFinish *finish_1;
  HighsInt iFn_2;
  double Kai_1;
  HVector *Row;
  double new_pivotal_edge_weight_1;
  HVector *Col;
  MFinish *finish;
  HighsInt iFn_1;
  double aa_iRow;
  HighsInt iRow;
  double Kai;
  double *dseArray;
  double *colArray;
  double new_pivotal_edge_weight;
  HighsInt iFn;
  vector<double,_std::allocator<double>_> *edge_weight;
  double *local_work_infeasibility;
  double *mixArray;
  bool updatePrimal_inDense;
  string *in_stack_fffffffffffffe38;
  HEkkDual *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  HighsInt in_stack_fffffffffffffe4c;
  HEkkDualRHS *in_stack_fffffffffffffe50;
  HEkkDualRHS *pHVar7;
  HVector *in_stack_fffffffffffffe58;
  HVector *pHVar8;
  HEkk *in_stack_fffffffffffffe60;
  allocator local_171;
  string local_170 [8];
  double in_stack_fffffffffffffe98;
  HVector *in_stack_fffffffffffffea0;
  HEkkDualRHS *in_stack_fffffffffffffea8;
  double local_150;
  double local_148;
  int local_140;
  int local_13c;
  double local_138;
  int local_130;
  int local_12c;
  double local_128;
  double *local_120;
  double *local_118;
  value_type local_110;
  int local_108;
  int local_104;
  vector<double,_std::allocator<double>_> *local_100;
  double local_f8;
  int local_ec;
  long local_e8;
  int local_dc;
  HEkk *local_d8;
  undefined8 local_d0;
  HVector *local_c8;
  HEkkDualRHS *local_c0;
  long local_b8;
  int local_ac;
  double local_a8;
  double local_a0;
  int local_94;
  double **local_90;
  vector<double,_std::allocator<double>_> *local_88;
  double *local_80;
  double *local_78;
  double **local_70;
  double local_68;
  double *local_60;
  double *local_58;
  double local_50;
  int local_44;
  vector<double,_std::allocator<double>_> *local_40;
  double **local_30;
  double **local_28;
  double *local_20;
  double *local_18;
  undefined1 local_9;
  
  local_9 = *(int *)(in_RDI + 0x728) < 0;
  if ((bool)local_9) {
    local_18 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x792782);
    local_20 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x79279f);
    local_30 = &local_18;
    local_28 = &local_20;
    ::highs::parallel::for_each<HEkkDual::majorUpdatePrimal()::__0>
              ((HighsInt)((ulong)in_stack_fffffffffffffe50 >> 0x20),
               (HighsInt)in_stack_fffffffffffffe50,
               (anon_class_24_3_f997d2ca *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               (HighsInt)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    if ((*(int *)(in_RDI + 0xac) == 2) ||
       ((*(int *)(in_RDI + 0xac) == 1 && ((*(byte *)(in_RDI + 8) & 1) == 0)))) {
      local_40 = (vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x10) + 0x2a20);
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x14cc); local_44 = local_44 + 1) {
        local_50 = *(double *)(in_RDI + (long)local_44 * 0x78 + 0x2770);
        local_58 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x7928a5);
        if (*(int *)(in_RDI + 0xac) == 2) {
          local_60 = std::vector<double,_std::allocator<double>_>::data
                               ((vector<double,_std::allocator<double>_> *)0x7928e9);
          local_68 = -2.0 / *(double *)(in_RDI + (long)local_44 * 0x78 + 0x2750);
          local_90 = &local_58;
          local_88 = local_40;
          local_80 = &local_50;
          local_78 = &local_68;
          local_70 = &local_60;
          ::highs::parallel::for_each<HEkkDual::majorUpdatePrimal()::__1>
                    ((HighsInt)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                     (HighsInt)in_stack_fffffffffffffe50,
                     (anon_class_40_5_b11b0fa6 *)
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     (HighsInt)((ulong)in_stack_fffffffffffffe40 >> 0x20));
        }
        else {
          for (local_94 = 0; local_94 < *(int *)(in_RDI + 0x18); local_94 = local_94 + 1) {
            local_a0 = local_58[local_94];
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_40,(long)local_94);
            local_a8 = local_50 * local_a0 * local_a0;
            pdVar4 = std::max<double>(pvVar3,&local_a8);
            dVar1 = *pdVar4;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_40,(long)local_94);
            *pvVar3 = dVar1;
          }
        }
      }
    }
  }
  else {
    HEkkDualRHS::updatePrimal
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    HEkkDualRHS::updateInfeasList
              (in_stack_fffffffffffffe50,
               (HVector *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x14cc); local_ac = local_ac + 1) {
      local_b8 = in_RDI + 0x2718 + (long)local_ac * 0x78;
      pHVar7 = *(HEkkDualRHS **)(local_b8 + 0x68);
      pHVar8 = *(HVector **)(local_b8 + 0x58);
      local_c8 = pHVar8;
      local_c0 = pHVar7;
      if (*(int *)(in_RDI + 0xac) == 2) {
        local_d0 = *(undefined8 *)(local_b8 + 0x60);
        in_stack_fffffffffffffe60 = (HEkk *)(-2.0 / *(double *)(local_b8 + 0x38));
        in_stack_fffffffffffffe40 = *(HEkkDual **)(in_RDI + 0x10);
        in_stack_fffffffffffffe48 = *(undefined4 *)(in_RDI + 0x7b0);
        in_stack_fffffffffffffe4c = *(HighsInt *)(in_RDI + 0x7bc);
        local_d8 = in_stack_fffffffffffffe60;
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x792bc9);
        HEkk::updateDualSteepestEdgeWeights
                  (in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030,
                   in_stack_00000028,in_stack_00000020,in_stack_00000018);
        in_stack_fffffffffffffe50 = pHVar7;
        in_stack_fffffffffffffe58 = pHVar8;
      }
      else if ((*(int *)(in_RDI + 0xac) == 1) && ((*(byte *)(in_RDI + 8) & 1) == 0)) {
        HEkk::updateDualDevexWeights
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (double)in_stack_fffffffffffffe50);
      }
      HEkkDualRHS::updateInfeasList
                (in_stack_fffffffffffffe50,
                 (HVector *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
  }
  for (local_dc = 0; local_dc < *(int *)(in_RDI + 0x14cc); local_dc = local_dc + 1) {
    local_e8 = in_RDI + 0x2718 + (long)local_dc * 0x78;
    local_ec = *(int *)(local_e8 + 0x28);
    local_f8 = (*(double *)(*(long *)(in_RDI + 0x68) + (long)local_ec * 8) -
               *(double *)(local_e8 + 0x48)) + *(double *)(local_e8 + 0x50);
    HEkkDualRHS::updatePivots
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,(double)in_stack_fffffffffffffe40
              );
  }
  if ((*(int *)(in_RDI + 0xac) == 2) ||
     ((*(int *)(in_RDI + 0xac) == 1 && ((*(byte *)(in_RDI + 8) & 1) == 0)))) {
    local_100 = (vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x10) + 0x2a20);
    for (local_104 = 0; local_104 < *(int *)(in_RDI + 0x14cc); local_104 = local_104 + 1) {
      local_108 = *(int *)(in_RDI + (long)local_104 * 0x78 + 0x2740);
      local_110 = *(value_type *)(in_RDI + (long)local_104 * 0x78 + 0x2770);
      local_118 = std::vector<double,_std::allocator<double>_>::data
                            ((vector<double,_std::allocator<double>_> *)0x792df6);
      if (*(int *)(in_RDI + 0xac) == 2) {
        local_120 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x792e3a);
        local_128 = -2.0 / *(double *)(in_RDI + (long)local_104 * 0x78 + 0x2750);
        for (local_12c = 0; vVar2 = local_110, local_12c < local_104; local_12c = local_12c + 1) {
          local_130 = *(int *)(in_RDI + (long)local_12c * 0x78 + 0x2740);
          dVar1 = local_118[local_130];
          dVar6 = local_128 * local_120[local_130];
          dVar5 = local_110 * dVar1;
          local_138 = dVar1;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_100,(long)local_130);
          *pvVar3 = dVar1 * (dVar5 + dVar6) + *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_100,(long)local_130);
          pdVar4 = std::max<double>(&kMinDualSteepestEdgeWeight,pvVar3);
          in_stack_fffffffffffffe38 = (string *)*pdVar4;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_100,(long)local_130);
          *pvVar3 = (value_type)in_stack_fffffffffffffe38;
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_100,(long)local_108)
        ;
        *pvVar3 = vVar2;
      }
      else {
        for (local_13c = 0; vVar2 = local_110, local_13c < local_104; local_13c = local_13c + 1) {
          local_140 = *(int *)(in_RDI + (long)local_13c * 0x78 + 0x2740);
          local_148 = local_118[local_108];
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_100,(long)local_140);
          local_150 = local_110 * local_148 * local_148;
          pdVar4 = std::max<double>(pvVar3,&local_150);
          dVar1 = *pdVar4;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_100,(long)local_140);
          *pvVar3 = dVar1;
        }
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_100,(long)local_108)
        ;
        *pvVar3 = vVar2;
        *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"999",&local_171);
  checkNonUnitWeightError(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  return;
}

Assistant:

void HEkkDual::majorUpdatePrimal() {
  const bool updatePrimal_inDense = dualRHS.workCount < 0;
  if (updatePrimal_inDense) {
    // Dense update of primal values, infeasibility list and
    // non-pivotal edge weights
    const double* mixArray = col_BFRT.array.data();
    double* local_work_infeasibility = dualRHS.work_infeasibility.data();
    // #pragma omp parallel for schedule(static)
    highs::parallel::for_each(
        0, solver_num_row,
        [&](HighsInt start, HighsInt end) {
          for (HighsInt iRow = start; iRow < end; iRow++) {
            baseValue[iRow] -= mixArray[iRow];
            const double value = baseValue[iRow];
            const double less = baseLower[iRow] - value;
            const double more = value - baseUpper[iRow];
            double infeas = less > Tp ? less : (more > Tp ? more : 0);
            if (ekk_instance_.info_.store_squared_primal_infeasibility)
              local_work_infeasibility[iRow] = infeas * infeas;
            else
              local_work_infeasibility[iRow] = fabs(infeas);
          }
        },
        100);

    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge ||
        (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework)) {
      // Dense update of any edge weights (except weights for pivotal rows)
      std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
      for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
        // multi_finish[iFn].EdWt has already been transformed to correspond to
        // the new basis
        const double new_pivotal_edge_weight = multi_finish[iFn].EdWt;
        const double* colArray = multi_finish[iFn].col_aq->array.data();
        if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
          // Update steepest edge weights
          const double* dseArray = multi_finish[iFn].row_ep->array.data();
          const double Kai = -2 / multi_finish[iFn].alpha_row;
          // #pragma omp parallel for schedule(static)
          highs::parallel::for_each(
              0, solver_num_row,
              [&](HighsInt start, HighsInt end) {
                for (HighsInt iRow = start; iRow < end; iRow++) {
                  const double aa_iRow = colArray[iRow];
                  edge_weight[iRow] +=
                      aa_iRow * (new_pivotal_edge_weight * aa_iRow +
                                 Kai * dseArray[iRow]);
                  edge_weight[iRow] =
                      max(kMinDualSteepestEdgeWeight, edge_weight[iRow]);
                }
              },
              100);
        } else {
          // Update Devex weights
          for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
            const double aa_iRow = colArray[iRow];
            edge_weight[iRow] = max(
                edge_weight[iRow], new_pivotal_edge_weight * aa_iRow * aa_iRow);
          }
        }
      }
    }
  } else {
    // Sparse update of primal values, infeasibility list and
    // non-pivotal edge weights
    dualRHS.updatePrimal(&col_BFRT, 1);
    dualRHS.updateInfeasList(&col_BFRT);

    // Sparse update of any edge weights and infeasList. Weights for
    // rows pivotal in this set of MI are updated, but this is based
    // on the previous updated weights not the computed pivotal weight
    // that's known. For the rows pivotal in this set of MI, the
    // weights will be over-written in the next section of code.
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      MFinish* finish = &multi_finish[iFn];
      HVector* Col = finish->col_aq;
      const double new_pivotal_edge_weight = finish->EdWt;
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        // Update steepest edge weights
        HVector* Row = finish->row_ep;
        double Kai = -2 / finish->alpha_row;
        ekk_instance_.updateDualSteepestEdgeWeights(row_out, variable_in, Col,
                                                    new_pivotal_edge_weight,
                                                    Kai, Row->array.data());
      } else if (edge_weight_mode == EdgeWeightMode::kDevex &&
                 !new_devex_framework) {
        // Update Devex weights
        ekk_instance_.updateDualDevexWeights(Col, new_pivotal_edge_weight);
      }
      dualRHS.updateInfeasList(Col);
    }
  }

  // Update primal value for the rows pivotal in this set of MI
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HighsInt iRow = finish->row_out;
    double value = baseValue[iRow] - finish->basicBound + finish->basicValue;
    dualRHS.updatePivots(iRow, value);
  }

  // Update any edge weights for the rows pivotal in this set of MI.
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge ||
      (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework)) {
    // Update weights for the pivots using the computed values.
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      const HighsInt iRow = multi_finish[iFn].row_out;
      const double new_pivotal_edge_weight = multi_finish[iFn].EdWt;
      const double* colArray = multi_finish[iFn].col_aq->array.data();
      // The weight for this pivot is known, but weights for rows
      // pivotal earlier need to be updated
      if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
        // Steepest edge
        const double* dseArray = multi_finish[iFn].row_ep->array.data();
        double Kai = -2 / multi_finish[iFn].alpha_row;
        for (HighsInt jFn = 0; jFn < iFn; jFn++) {
          HighsInt jRow = multi_finish[jFn].row_out;
          double value = colArray[jRow];
          edge_weight[jRow] +=
              value * (new_pivotal_edge_weight * value + Kai * dseArray[jRow]);
          edge_weight[jRow] =
              max(kMinDualSteepestEdgeWeight, edge_weight[jRow]);
        }
        edge_weight[iRow] = new_pivotal_edge_weight;
      } else {
        // Devex
        for (HighsInt jFn = 0; jFn < iFn; jFn++) {
          HighsInt jRow = multi_finish[jFn].row_out;
          const double aa_iRow = colArray[iRow];
          edge_weight[jRow] = max(edge_weight[jRow],
                                  new_pivotal_edge_weight * aa_iRow * aa_iRow);
        }
        edge_weight[iRow] = new_pivotal_edge_weight;
        num_devex_iterations++;
      }
    }
  }
  checkNonUnitWeightError("999");
}